

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_casts.cpp
# Opt level: O1

bool duckdb::ArrayToArrayCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  BoundCastData *pBVar1;
  unsigned_long *puVar2;
  undefined1 uVar3;
  string *msg_00;
  string *params;
  Vector *pVVar4;
  Vector *pVVar5;
  unsigned_long in_R8;
  string msg;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  string local_60;
  idx_t local_40;
  undefined1 local_38;
  
  msg_00 = (string *)ArrayType::GetSize(&source->type);
  params = (string *)ArrayType::GetSize(&result->type);
  if (msg_00 != params) {
    local_80[0] = local_70;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,"Cannot cast array of size %u to array of size %u","");
    Exception::ConstructMessage<unsigned_long,unsigned_long>
              (&local_60,(Exception *)local_80,msg_00,(unsigned_long)params,in_R8);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0]);
    }
    HandleCastError::AssignError
              (&local_60,parameters->error_message,(optional_idx)(parameters->query_location).index)
    ;
    if (parameters->strict == false) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      ConstantVector::SetNull(result,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      return false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  optional_ptr<duckdb::BoundCastData,_true>::CheckValid(&parameters->cast_data);
  pBVar1 = (parameters->cast_data).ptr;
  if (source->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar2 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
    }
    pVVar4 = ArrayVector::GetEntry(source);
    pVVar5 = ArrayVector::GetEntry(result);
    local_60._M_dataplus._M_p = (pointer)pBVar1[3]._vptr_BoundCastData;
    local_60._M_string_length._0_1_ = parameters->strict;
    local_60.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)&parameters->error_message;
    local_60.field_2._M_allocated_capacity._4_4_ =
         *(undefined4 *)((long)&parameters->error_message + 4);
    local_60.field_2._8_4_ = *(undefined4 *)&(parameters->local_state).ptr;
    local_60.field_2._12_4_ = *(undefined4 *)((long)&(parameters->local_state).ptr + 4);
    local_40 = (parameters->query_location).index;
  }
  else {
    Vector::Flatten(source,count);
    Vector::SetVectorType(result,FLAT_VECTOR);
    FlatVector::VerifyFlatVector(source);
    FlatVector::VerifyFlatVector(result);
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
               &(source->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
    (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
         (source->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
    pVVar4 = ArrayVector::GetEntry(source);
    pVVar5 = ArrayVector::GetEntry(result);
    local_60._M_dataplus._M_p = (pointer)pBVar1[3]._vptr_BoundCastData;
    local_60._M_string_length._0_1_ = parameters->strict;
    local_60.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)&parameters->error_message;
    local_60.field_2._M_allocated_capacity._4_4_ =
         *(undefined4 *)((long)&parameters->error_message + 4);
    local_60.field_2._8_4_ = *(undefined4 *)&(parameters->local_state).ptr;
    local_60.field_2._12_4_ = *(undefined4 *)((long)&(parameters->local_state).ptr + 4);
    local_40 = (parameters->query_location).index;
    msg_00 = (string *)((long)msg_00 * count);
  }
  local_38 = 0;
  uVar3 = (*(code *)pBVar1[1]._vptr_BoundCastData)(pVVar4,pVVar5,msg_00);
  return (bool)uVar3;
}

Assistant:

static bool ArrayToArrayCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {

	auto source_array_size = ArrayType::GetSize(source.GetType());
	auto target_array_size = ArrayType::GetSize(result.GetType());
	if (source_array_size != target_array_size) {
		// Cant cast between arrays of different sizes
		auto msg = StringUtil::Format("Cannot cast array of size %u to array of size %u", source_array_size,
		                              target_array_size);
		HandleCastError::AssignError(msg, parameters);
		if (!parameters.strict) {
			// if this was a TRY_CAST, we know every row will fail, so just return null
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return false;
		}
	}

	auto &cast_data = parameters.cast_data->Cast<ArrayBoundCastData>();
	if (source.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		if (ConstantVector::IsNull(source)) {
			ConstantVector::SetNull(result, true);
		}

		auto &source_cc = ArrayVector::GetEntry(source);
		auto &result_cc = ArrayVector::GetEntry(result);

		// If the array vector is constant, the child vector must be flat (or constant if array size is 1)
		D_ASSERT(source_cc.GetVectorType() == VectorType::FLAT_VECTOR || source_array_size == 1);

		CastParameters child_parameters(parameters, cast_data.child_cast_info.cast_data, parameters.local_state);
		bool all_ok = cast_data.child_cast_info.function(source_cc, result_cc, source_array_size, child_parameters);
		return all_ok;
	} else {
		// Flatten if not constant
		source.Flatten(count);
		result.SetVectorType(VectorType::FLAT_VECTOR);

		FlatVector::SetValidity(result, FlatVector::Validity(source));
		auto &source_cc = ArrayVector::GetEntry(source);
		auto &result_cc = ArrayVector::GetEntry(result);

		CastParameters child_parameters(parameters, cast_data.child_cast_info.cast_data, parameters.local_state);
		bool all_ok =
		    cast_data.child_cast_info.function(source_cc, result_cc, count * source_array_size, child_parameters);
		return all_ok;
	}
}